

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_sniffer.cpp
# Opt level: O1

void __thiscall duckdb::CSVSniffer::SetResultOptions(CSVSniffer *this)

{
  unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
  *this_00;
  pointer pLVar1;
  CSVReaderOptions *original;
  bool bVar2;
  pointer pSVar3;
  CSVStateMachine *pCVar4;
  bool found_timestamp;
  bool found_date;
  pointer this_01;
  LogicalType local_48;
  
  this_01 = (this->detected_types).
            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start;
  pLVar1 = (this->detected_types).
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (this_01 == pLVar1) {
    found_timestamp = false;
    found_date = false;
  }
  else {
    found_date = false;
    found_timestamp = false;
    do {
      LogicalType::LogicalType(&local_48,DATE);
      bVar2 = LogicalType::operator==(this_01,&local_48);
      LogicalType::~LogicalType(&local_48);
      if (bVar2) {
        found_date = true;
      }
      else {
        LogicalType::LogicalType(&local_48,TIMESTAMP);
        bVar2 = LogicalType::operator==(this_01,&local_48);
        LogicalType::~LogicalType(&local_48);
        if (bVar2) {
          found_timestamp = true;
        }
      }
      this_01 = this_01 + 1;
    } while (this_01 != pLVar1);
  }
  original = this->options;
  this_00 = &this->best_candidate;
  pSVar3 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
           ::operator->(this_00);
  pCVar4 = BaseScanner::GetStateMachine(&pSVar3->super_BaseScanner);
  MatchAndReplaceUserSetVariables
            (&original->dialect_options,&pCVar4->dialect_options,
             &this->options->sniffer_user_mismatch_error,found_date,found_timestamp);
  pSVar3 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
           ::operator->(this_00);
  pCVar4 = BaseScanner::GetStateMachine(&pSVar3->super_BaseScanner);
  (this->options->dialect_options).num_cols = (pCVar4->dialect_options).num_cols;
  pSVar3 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
           ::operator->(this_00);
  pCVar4 = BaseScanner::GetStateMachine(&pSVar3->super_BaseScanner);
  (this->options->dialect_options).rows_until_header = (pCVar4->dialect_options).rows_until_header;
  return;
}

Assistant:

void CSVSniffer::SetResultOptions() const {
	bool found_date = false;
	bool found_timestamp = false;
	for (auto &type : detected_types) {
		if (type == LogicalType::DATE) {
			found_date = true;
		} else if (type == LogicalType::TIMESTAMP) {
			found_timestamp = true;
		}
	}
	MatchAndReplaceUserSetVariables(options.dialect_options, best_candidate->GetStateMachine().dialect_options,
	                                options.sniffer_user_mismatch_error, found_date, found_timestamp);
	options.dialect_options.num_cols = best_candidate->GetStateMachine().dialect_options.num_cols;
	options.dialect_options.rows_until_header = best_candidate->GetStateMachine().dialect_options.rows_until_header;
}